

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error mirror_dgpr<0>(context *ctx,token *token,opcode *op)

{
  ulong uVar1;
  ulong *in_RCX;
  error *err;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 & 0xffffffffffffff00;
  dgpr<0>(ctx,token,op);
  if (ctx->pc == 0) {
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)ctx);
    if (*in_RCX == uVar1) {
      ctx->pc = 0;
    }
    else {
      fail((token *)ctx,(char *)op,"source register is not mirrored to destination register");
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(mirror_dgpr)
{
    // Hack mirror detecting by restoring the bits and then comparing
    const uint64_t old_op_value = op.value;
    op.value &= ~(uint64_t{0xff} << address);
    if (auto err = dgpr<address>(ctx, token, op)) {
        return err;
    }
    if (op.value != old_op_value) {
        return fail(token, "source register is not mirrored to destination register");
    }
    return {};
}